

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O0

void __thiscall Function::check_epilogue(Function *this,LinkedObjectFile *file)

{
  MatchParam<int> offset;
  MatchParam<InstructionKind> kind;
  MatchParam<int> imm;
  MatchParam<InstructionKind> kind_00;
  MatchParam<int> offset_00;
  MatchParam<int> offset_01;
  MatchParam<int> offset_02;
  MatchParam<Register> dst_reg;
  MatchParam<Register> dst_reg_00;
  MatchParam<Register> dst_reg_01;
  long lVar1;
  MatchParam<int> size;
  MatchParam<int> size_00;
  MatchParam<int> size_01;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  long in_RDI;
  int expected_offset_1;
  value_type *expected_reg_1;
  int fpr_idx;
  int i_1;
  int expected_offset;
  value_type *expected_reg;
  int gpr_idx;
  int i;
  int idx;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  reference in_stack_fffffffffffffeb0;
  MatchParam<Register> in_stack_fffffffffffffeb8;
  MatchParam<Register> in_stack_fffffffffffffebc;
  InstructionKind in_stack_fffffffffffffec0;
  MatchParam<Register> in_stack_fffffffffffffec4;
  undefined8 in_stack_fffffffffffffec8;
  MatchParam<InstructionKind> in_stack_fffffffffffffed0;
  MatchParam<Register> in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  Register in_stack_fffffffffffffee6;
  undefined2 uVar7;
  MatchParam<bool> is_signed;
  int iVar8;
  undefined4 in_stack_fffffffffffffef0;
  MatchParam<int> local_104;
  uint16_t local_fc;
  MatchParam<bool> local_f6;
  MatchParam<int> local_f4;
  uint16_t local_ea;
  MatchParam<int> local_e4;
  uint16_t local_dc;
  MatchParam<bool> local_d6;
  MatchParam<int> local_d4;
  uint16_t local_ca;
  MatchParam<int> local_c4;
  uint16_t local_ba;
  int local_b4;
  reference local_b0;
  int local_a4;
  int local_a0;
  uint16_t local_9a;
  MatchParam<int> local_94;
  uint16_t local_8c;
  MatchParam<bool> local_86;
  MatchParam<int> local_84;
  int local_7c;
  reference local_78;
  int local_70;
  int local_6c;
  uint16_t local_66;
  uint16_t local_60;
  uint16_t local_5a;
  MatchParam<InstructionKind> local_54;
  MatchParam<int> local_4c;
  uint16_t local_44;
  uint16_t local_3e;
  MatchParam<InstructionKind> local_38;
  uint16_t local_2e;
  uint16_t local_28;
  uint16_t local_22;
  MatchParam<InstructionKind> local_1c;
  int local_14;
  
  uVar7 = (undefined2)in_RDI;
  is_signed = SUB82((ulong)in_RDI >> 0x10,0);
  iVar8 = (int)((ulong)in_RDI >> 0x20);
  if (((*(byte *)(in_RDI + 0x98) & 1) == 0) || ((*(byte *)(in_RDI + 0x30) & 1) != 0)) {
    printf("not decoded, or suspected asm, skipping epilogue\n");
  }
  else {
    sVar4 = std::vector<Instruction,_std::allocator<Instruction>_>::size
                      ((vector<Instruction,_std::allocator<Instruction>_> *)(in_RDI + 0x38));
    local_14 = (int)sVar4;
    do {
      local_14 = local_14 + -1;
      std::vector<Instruction,_std::allocator<Instruction>_>::at
                ((vector<Instruction,_std::allocator<Instruction>_> *)in_stack_fffffffffffffeb0,
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      bVar2 = is_nop((Instruction *)in_stack_fffffffffffffed0);
    } while (bVar2);
    lVar1 = CONCAT44(iVar8,CONCAT22(is_signed,uVar7));
    *(int *)(lVar1 + 0x74) = local_14;
    if (*(int *)(lVar1 + 0x9c) == 0) {
      in_stack_fffffffffffffed0 =
           (MatchParam<InstructionKind>)
           std::vector<Instruction,_std::allocator<Instruction>_>::at
                     ((vector<Instruction,_std::allocator<Instruction>_> *)in_stack_fffffffffffffeb0
                      ,CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      MatchParam<InstructionKind>::MatchParam(&local_54,DADDU);
      local_5a = (uint16_t)make_gpr(0x1ba35f);
      MatchParam<Register>::MatchParam
                ((MatchParam<Register> *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 (Register)(uint16_t)((ulong)in_stack_fffffffffffffeb0 >> 0x30));
      local_60 = (uint16_t)make_gpr(0x1ba386);
      MatchParam<Register>::MatchParam
                ((MatchParam<Register> *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 (Register)(uint16_t)((ulong)in_stack_fffffffffffffeb0 >> 0x30));
      local_66 = (uint16_t)make_gpr(0x1ba3aa);
      MatchParam<Register>::MatchParam
                ((MatchParam<Register> *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 (Register)(uint16_t)((ulong)in_stack_fffffffffffffeb0 >> 0x30));
      kind_00._4_4_ = in_stack_fffffffffffffec4;
      kind_00.value = in_stack_fffffffffffffec0;
      bVar2 = is_gpr_3((Instruction *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                       kind_00,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,
                       SUB84((ulong)in_stack_fffffffffffffeb0 >> 0x20,0));
      if (!bVar2) {
        __assert_fail("is_gpr_3(instructions.at(idx), InstructionKind::DADDU, make_gpr(Reg::SP), make_gpr(Reg::SP), make_gpr(Reg::R0))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Function/Function.cpp"
                      ,0x166,"void Function::check_epilogue(const LinkedObjectFile &)");
      }
    }
    else {
      pvVar5 = std::vector<Instruction,_std::allocator<Instruction>_>::at
                         ((vector<Instruction,_std::allocator<Instruction>_> *)
                          in_stack_fffffffffffffeb0,
                          CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      in_stack_fffffffffffffee0 = SUB84(pvVar5,0);
      in_stack_fffffffffffffee6.id = (uint16_t)((ulong)pvVar5 >> 0x30);
      MatchParam<InstructionKind>::MatchParam(&local_1c,DADDU);
      local_22 = (uint16_t)make_gpr(0x1ba10d);
      MatchParam<Register>::MatchParam
                ((MatchParam<Register> *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 (Register)(uint16_t)((ulong)in_stack_fffffffffffffeb0 >> 0x30));
      local_28 = (uint16_t)make_gpr(0x1ba134);
      MatchParam<Register>::MatchParam
                ((MatchParam<Register> *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 (Register)(uint16_t)((ulong)in_stack_fffffffffffffeb0 >> 0x30));
      local_2e = (uint16_t)make_gpr(0x1ba158);
      MatchParam<Register>::MatchParam
                ((MatchParam<Register> *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 (Register)(uint16_t)((ulong)in_stack_fffffffffffffeb0 >> 0x30));
      kind._4_4_ = in_stack_fffffffffffffec4;
      kind.value = in_stack_fffffffffffffec0;
      bVar2 = is_gpr_3((Instruction *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                       kind,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,
                       SUB84((ulong)in_stack_fffffffffffffeb0 >> 0x20,0));
      if (bVar2) {
        local_14 = local_14 + -1;
        std::vector<Instruction,_std::allocator<Instruction>_>::at
                  ((vector<Instruction,_std::allocator<Instruction>_> *)in_stack_fffffffffffffeb0,
                   CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        bVar2 = is_jr_ra(in_stack_fffffffffffffeb0);
        if (!bVar2) {
          __assert_fail("is_jr_ra(instructions.at(idx))",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Function/Function.cpp"
                        ,0x159,"void Function::check_epilogue(const LinkedObjectFile &)");
        }
        local_14 = local_14 + -1;
        printf(
              "[Warning] Double Return Epilogue Hack!  This is probably an ASM function in disguise\n"
              );
        std::__cxx11::string::operator+=
                  ((string *)(CONCAT44(iVar8,CONCAT22(is_signed,uVar7)) + 0x78),
                   "Double Return Epilogue - this is probably an ASM function\n");
      }
      pvVar5 = std::vector<Instruction,_std::allocator<Instruction>_>::at
                         ((vector<Instruction,_std::allocator<Instruction>_> *)
                          in_stack_fffffffffffffeb0,
                          CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      in_stack_fffffffffffffed8 = SUB84(pvVar5,0);
      in_stack_fffffffffffffedc = (int)((ulong)pvVar5 >> 0x20);
      MatchParam<InstructionKind>::MatchParam(&local_38,DADDIU);
      local_3e = (uint16_t)make_gpr(0x1ba267);
      MatchParam<Register>::MatchParam
                ((MatchParam<Register> *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 (Register)(uint16_t)((ulong)in_stack_fffffffffffffeb0 >> 0x30));
      local_44 = (uint16_t)make_gpr(0x1ba28e);
      MatchParam<Register>::MatchParam
                ((MatchParam<Register> *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 (Register)(uint16_t)((ulong)in_stack_fffffffffffffeb0 >> 0x30));
      MatchParam<int>::MatchParam
                (&local_4c,*(int *)(CONCAT44(iVar8,CONCAT22(is_signed,uVar7)) + 0x9c));
      imm._4_4_ = in_stack_fffffffffffffec4;
      imm.value = in_stack_fffffffffffffec0;
      bVar2 = is_gpr_2_imm_int((Instruction *)
                               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                               in_stack_fffffffffffffed0,
                               SUB84((ulong)in_stack_fffffffffffffec8 >> 0x20,0),
                               SUB84(in_stack_fffffffffffffec8,0),imm);
      if (!bVar2) {
        __assert_fail("is_gpr_2_imm_int(instructions.at(idx), InstructionKind::DADDIU, make_gpr(Reg::SP), make_gpr(Reg::SP), prologue.total_stack_usage)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Function/Function.cpp"
                      ,0x161,"void Function::check_epilogue(const LinkedObjectFile &)");
      }
    }
    local_14 = local_14 + -1;
    std::vector<Instruction,_std::allocator<Instruction>_>::at
              ((vector<Instruction,_std::allocator<Instruction>_> *)in_stack_fffffffffffffeb0,
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    bVar2 = is_jr_ra(in_stack_fffffffffffffeb0);
    if (!bVar2) {
      __assert_fail("is_jr_ra(instructions.at(idx))",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Function/Function.cpp"
                    ,0x16b,"void Function::check_epilogue(const LinkedObjectFile &)");
    }
    for (local_6c = 0; local_14 = local_14 + -1,
        local_6c < *(int *)(CONCAT44(iVar8,CONCAT22(is_signed,uVar7)) + 0xb4);
        local_6c = local_6c + 1) {
      local_70 = *(int *)(CONCAT44(iVar8,CONCAT22(is_signed,uVar7)) + 0xb4) - (local_6c + 1);
      local_78 = std::vector<Register,_std::allocator<Register>_>::at
                           ((vector<Register,_std::allocator<Register>_> *)in_stack_fffffffffffffeb0
                            ,CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      local_7c = *(int *)(CONCAT44(iVar8,CONCAT22(is_signed,uVar7)) + 0xb8) + local_6c * 0x10;
      std::vector<Instruction,_std::allocator<Instruction>_>::at
                ((vector<Instruction,_std::allocator<Instruction>_> *)in_stack_fffffffffffffeb0,
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      MatchParam<int>::MatchParam(&local_84,0x10);
      MatchParam<bool>::MatchParam(&local_86,true);
      local_8c = local_78->id;
      MatchParam<Register>::MatchParam
                ((MatchParam<Register> *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 (Register)(uint16_t)((ulong)in_stack_fffffffffffffeb0 >> 0x30));
      MatchParam<int>::MatchParam(&local_94,local_7c);
      local_9a = (uint16_t)make_gpr(0x1ba578);
      MatchParam<Register>::MatchParam
                ((MatchParam<Register> *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 (Register)(uint16_t)((ulong)in_stack_fffffffffffffeb0 >> 0x30));
      size._4_4_ = in_stack_fffffffffffffef0;
      size.value = iVar8;
      dst_reg._2_2_ = uVar7;
      dst_reg.value.id = in_stack_fffffffffffffee6.id;
      offset_00._4_4_ = in_stack_fffffffffffffee0;
      offset_00.value = in_stack_fffffffffffffedc;
      bVar2 = is_no_ll_gpr_load((Instruction *)in_stack_fffffffffffffed0,size,is_signed,dst_reg,
                                offset_00,in_stack_fffffffffffffed8);
      if (!bVar2) {
        __assert_fail("is_no_ll_gpr_load(instructions.at(idx), 16, true, expected_reg, expected_offset, make_gpr(Reg::SP))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Function/Function.cpp"
                      ,0x174,"void Function::check_epilogue(const LinkedObjectFile &)");
      }
    }
    for (local_a0 = 0; local_a0 < *(int *)(CONCAT44(iVar8,CONCAT22(is_signed,uVar7)) + 0xbc);
        local_a0 = local_a0 + 1) {
      local_a4 = *(int *)(CONCAT44(iVar8,CONCAT22(is_signed,uVar7)) + 0xbc) - (local_a0 + 1);
      local_b0 = std::vector<Register,_std::allocator<Register>_>::at
                           ((vector<Register,_std::allocator<Register>_> *)in_stack_fffffffffffffeb0
                            ,CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      local_b4 = *(int *)(CONCAT44(iVar8,CONCAT22(is_signed,uVar7)) + 0xc0) + local_a0 * 4;
      pvVar5 = std::vector<Instruction,_std::allocator<Instruction>_>::at
                         ((vector<Instruction,_std::allocator<Instruction>_> *)
                          in_stack_fffffffffffffeb0,
                          CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      in_stack_fffffffffffffec0 = (InstructionKind)pvVar5;
      in_stack_fffffffffffffec4 = SUB84((ulong)pvVar5 >> 0x20,0);
      local_ba = local_b0->id;
      MatchParam<Register>::MatchParam
                ((MatchParam<Register> *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 (Register)(uint16_t)((ulong)in_stack_fffffffffffffeb0 >> 0x30));
      MatchParam<int>::MatchParam(&local_c4,local_b4);
      local_ca = (uint16_t)make_gpr(0x1ba6ee);
      MatchParam<Register>::MatchParam
                ((MatchParam<Register> *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 (Register)(uint16_t)((ulong)in_stack_fffffffffffffeb0 >> 0x30));
      offset._4_4_ = in_stack_fffffffffffffec0;
      offset.value._0_2_ = in_stack_fffffffffffffebc.value.id;
      offset.value._2_1_ = in_stack_fffffffffffffebc.is_wildcard;
      offset.value._3_1_ = in_stack_fffffffffffffebc._3_1_;
      bVar2 = is_no_ll_fpr_load(in_stack_fffffffffffffeb0,in_stack_fffffffffffffec4,offset,
                                in_stack_fffffffffffffeb8);
      if (!bVar2) {
        __assert_fail("is_no_ll_fpr_load(instructions.at(idx), expected_reg, expected_offset, make_gpr(Reg::SP))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Function/Function.cpp"
                      ,0x17e,"void Function::check_epilogue(const LinkedObjectFile &)");
      }
      local_14 = local_14 + -1;
    }
    if ((*(byte *)(CONCAT44(iVar8,CONCAT22(is_signed,uVar7)) + 0xa8) & 1) != 0) {
      std::vector<Instruction,_std::allocator<Instruction>_>::at
                ((vector<Instruction,_std::allocator<Instruction>_> *)in_stack_fffffffffffffeb0,
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      MatchParam<int>::MatchParam(&local_d4,8);
      MatchParam<bool>::MatchParam(&local_d6,true);
      local_dc = (uint16_t)make_gpr(0x1ba7d4);
      MatchParam<Register>::MatchParam
                ((MatchParam<Register> *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 (Register)(uint16_t)((ulong)in_stack_fffffffffffffeb0 >> 0x30));
      MatchParam<int>::MatchParam
                (&local_e4,*(int *)(CONCAT44(iVar8,CONCAT22(is_signed,uVar7)) + 0xac));
      local_ea = (uint16_t)make_gpr(0x1ba807);
      MatchParam<Register>::MatchParam
                ((MatchParam<Register> *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 (Register)(uint16_t)((ulong)in_stack_fffffffffffffeb0 >> 0x30));
      size_00._4_4_ = in_stack_fffffffffffffef0;
      size_00.value = iVar8;
      dst_reg_00._2_2_ = uVar7;
      dst_reg_00.value.id = in_stack_fffffffffffffee6.id;
      offset_01._4_4_ = in_stack_fffffffffffffee0;
      offset_01.value = in_stack_fffffffffffffedc;
      bVar2 = is_no_ll_gpr_load((Instruction *)in_stack_fffffffffffffed0,size_00,is_signed,
                                dst_reg_00,offset_01,in_stack_fffffffffffffed8);
      if (!bVar2) {
        __assert_fail("is_no_ll_gpr_load(instructions.at(idx), 8, true, make_gpr(Reg::FP), prologue.fp_backup_offset, make_gpr(Reg::SP))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Function/Function.cpp"
                      ,0x185,"void Function::check_epilogue(const LinkedObjectFile &)");
      }
      local_14 = local_14 + -1;
    }
    if ((*(byte *)(CONCAT44(iVar8,CONCAT22(is_signed,uVar7)) + 0xa0) & 1) != 0) {
      in_stack_fffffffffffffeb0 =
           std::vector<Instruction,_std::allocator<Instruction>_>::at
                     ((vector<Instruction,_std::allocator<Instruction>_> *)in_stack_fffffffffffffeb0
                      ,CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      MatchParam<int>::MatchParam(&local_f4,8);
      MatchParam<bool>::MatchParam(&local_f6,true);
      local_fc = (uint16_t)make_gpr(0x1ba8d3);
      MatchParam<Register>::MatchParam
                ((MatchParam<Register> *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 (Register)(uint16_t)((ulong)in_stack_fffffffffffffeb0 >> 0x30));
      MatchParam<int>::MatchParam
                (&local_104,*(int *)(CONCAT44(iVar8,CONCAT22(is_signed,uVar7)) + 0xa4));
      make_gpr(0x1ba906);
      MatchParam<Register>::MatchParam
                ((MatchParam<Register> *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 (Register)(uint16_t)((ulong)in_stack_fffffffffffffeb0 >> 0x30));
      size_01._4_4_ = in_stack_fffffffffffffef0;
      size_01.value = iVar8;
      dst_reg_01._2_2_ = uVar7;
      dst_reg_01.value.id = in_stack_fffffffffffffee6.id;
      offset_02._4_4_ = in_stack_fffffffffffffee0;
      offset_02.value = in_stack_fffffffffffffedc;
      bVar2 = is_no_ll_gpr_load((Instruction *)in_stack_fffffffffffffed0,size_01,is_signed,
                                dst_reg_01,offset_02,in_stack_fffffffffffffed8);
      if (!bVar2) {
        __assert_fail("is_no_ll_gpr_load(instructions.at(idx), 8, true, make_gpr(Reg::RA), prologue.ra_backup_offset, make_gpr(Reg::SP))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Function/Function.cpp"
                      ,0x18c,"void Function::check_epilogue(const LinkedObjectFile &)");
      }
      local_14 = local_14 + -1;
    }
    bVar2 = std::vector<BasicBlock,_std::allocator<BasicBlock>_>::empty
                      ((vector<BasicBlock,_std::allocator<BasicBlock>_> *)
                       CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      __assert_fail("!basic_blocks.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Function/Function.cpp"
                    ,400,"void Function::check_epilogue(const LinkedObjectFile &)");
    }
    iVar3 = local_14 + 1;
    pvVar6 = std::vector<BasicBlock,_std::allocator<BasicBlock>_>::back
                       ((vector<BasicBlock,_std::allocator<BasicBlock>_> *)in_stack_fffffffffffffeb0
                       );
    if (iVar3 < pvVar6->start_word) {
      __assert_fail("idx + 1 >= basic_blocks.back().start_word",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Function/Function.cpp"
                    ,0x191,"void Function::check_epilogue(const LinkedObjectFile &)");
    }
    iVar3 = local_14 + 1;
    pvVar6 = std::vector<BasicBlock,_std::allocator<BasicBlock>_>::back
                       ((vector<BasicBlock,_std::allocator<BasicBlock>_> *)in_stack_fffffffffffffeb0
                       );
    lVar1 = CONCAT44(iVar8,CONCAT22(is_signed,uVar7));
    pvVar6->end_word = iVar3;
    *(undefined1 *)(lVar1 + 0xcc) = 1;
    *(int *)(lVar1 + 0x70) = local_14 + 1;
  }
  return;
}

Assistant:

void Function::check_epilogue(const LinkedObjectFile& file) {
  (void)file;
  if (!prologue.decoded || suspected_asm) {
    printf("not decoded, or suspected asm, skipping epilogue\n");
    return;
  }

  // start at the end and move up.
  int idx = int(instructions.size()) - 1;

  // seek past alignment nops
  while (is_nop(instructions.at(idx))) {
    idx--;
  }

  epilogue_end = idx;
  // stack restore
  if (prologue.total_stack_usage) {
    // hack - sometimes an asm function has a compiler inserted jr ra/daddu sp sp r0 that follows
    // the "true" return.  We really should have this function flagged as asm, but for now, we can
    // simply skip over the compiler-generated jr ra/daddu sp sp r0.
    if (is_gpr_3(instructions.at(idx), InstructionKind::DADDU, make_gpr(Reg::SP), make_gpr(Reg::SP),
                 make_gpr(Reg::R0))) {
      idx--;
      assert(is_jr_ra(instructions.at(idx)));
      idx--;
      printf(
          "[Warning] Double Return Epilogue Hack!  This is probably an ASM function in disguise\n");
      warnings += "Double Return Epilogue - this is probably an ASM function\n";
    }
    // delay slot should be daddiu sp, sp, offset
    assert(is_gpr_2_imm_int(instructions.at(idx), InstructionKind::DADDIU, make_gpr(Reg::SP),
                            make_gpr(Reg::SP), prologue.total_stack_usage));
    idx--;
  } else {
    // delay slot is always daddu sp, sp, r0...
    assert(is_gpr_3(instructions.at(idx), InstructionKind::DADDU, make_gpr(Reg::SP),
                    make_gpr(Reg::SP), make_gpr(Reg::R0)));
    idx--;
  }

  // jr ra
  assert(is_jr_ra(instructions.at(idx)));
  idx--;

  // restore gprs
  for (int i = 0; i < prologue.n_gpr_backup; i++) {
    int gpr_idx = prologue.n_gpr_backup - (1 + i);
    const auto& expected_reg = gpr_backups.at(gpr_idx);
    auto expected_offset = prologue.gpr_backup_offset + 16 * i;
    assert(is_no_ll_gpr_load(instructions.at(idx), 16, true, expected_reg, expected_offset,
                             make_gpr(Reg::SP)));
    idx--;
  }

  // restore fprs
  for (int i = 0; i < prologue.n_fpr_backup; i++) {
    int fpr_idx = prologue.n_fpr_backup - (1 + i);
    const auto& expected_reg = fpr_backups.at(fpr_idx);
    auto expected_offset = prologue.fpr_backup_offset + 4 * i;
    assert(
        is_no_ll_fpr_load(instructions.at(idx), expected_reg, expected_offset, make_gpr(Reg::SP)));
    idx--;
  }

  // restore fp
  if (prologue.fp_backed_up) {
    assert(is_no_ll_gpr_load(instructions.at(idx), 8, true, make_gpr(Reg::FP),
                             prologue.fp_backup_offset, make_gpr(Reg::SP)));
    idx--;
  }

  // restore ra
  if (prologue.ra_backed_up) {
    assert(is_no_ll_gpr_load(instructions.at(idx), 8, true, make_gpr(Reg::RA),
                             prologue.ra_backup_offset, make_gpr(Reg::SP)));
    idx--;
  }

  assert(!basic_blocks.empty());
  assert(idx + 1 >= basic_blocks.back().start_word);
  basic_blocks.back().end_word = idx + 1;
  prologue.epilogue_ok = true;
  epilogue_start = idx + 1;
}